

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpServer.cpp
# Opt level: O1

void FIX::HttpServer::startGlobal(SessionSettings *s)

{
  int iVar1;
  bool bVar2;
  HttpServer *this;
  string local_48;
  
  Mutex::lock((Mutex *)s_mutex);
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"HttpAcceptPort","");
  bVar2 = Dictionary::has(&s->m_defaults,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  if (bVar2) {
    s_count = s_count + 1;
    if (s_pServer == (HttpServer *)0x0) {
      this = (HttpServer *)operator_new(0xb0);
      HttpServer(this,s);
      s_pServer = this;
      start(this);
    }
  }
  iVar1 = s_mutex._48_4_ + -1;
  bVar2 = (int)s_mutex._48_4_ < 2;
  s_mutex._48_4_ = iVar1;
  if (bVar2) {
    s_mutex._40_8_ = 0;
    pthread_mutex_unlock((pthread_mutex_t *)s_mutex);
  }
  return;
}

Assistant:

EXCEPT(ConfigError, RuntimeError) {
  Locker l(s_mutex);

  if (!s.get().has(HTTP_ACCEPT_PORT)) {
    return;
  }

  s_count += 1;
  if (!s_pServer) {
    s_pServer = new HttpServer(s);
    s_pServer->start();
  }
}